

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

wchar_t e_cmp_tval(void *a,void *b)

{
  ego_item *peVar1;
  ego_item *peVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  wchar_t c;
  ego_item *eb;
  ego_item *ea;
  int b_val;
  int a_val;
  void *b_local;
  void *a_local;
  
  peVar1 = e_info;
  wVar5 = *a;
  wVar6 = *b;
  wVar3 = default_item_id(wVar5);
  peVar2 = e_info;
  wVar4 = default_item_id(wVar6);
  wVar5 = default_group_id(wVar5);
  wVar6 = default_group_id(wVar6);
  a_local._4_4_ = wVar5 - wVar6;
  if (a_local._4_4_ == L'\0') {
    a_local._4_4_ = strcmp(peVar1[wVar3].name,peVar2[wVar4].name);
  }
  return a_local._4_4_;
}

Assistant:

static int e_cmp_tval(const void *a, const void *b)
{
	const int a_val = *(const int *)a;
	const int b_val = *(const int *)b;
	const struct ego_item *ea = &e_info[default_item_id(a_val)];
	const struct ego_item *eb = &e_info[default_item_id(b_val)];

	/* Group by */
	int c = default_group_id(a_val) - default_group_id(b_val);
	if (c) return c;

	/* Order by */
	return strcmp(ea->name, eb->name);
}